

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

Aig_Tru_t ** Aig_RManTableLookup(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  Aig_Tru_t **ppAVar4;
  uint uVar5;
  Aig_Tru_t *pAVar6;
  ulong uVar7;
  Aig_Tru_t *pAVar8;
  Aig_Tru_t *pAVar9;
  
  uVar2 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar2 = 1;
  }
  if ((int)uVar2 < 1) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 ^ Aig_RManTableLookup::s_Primes[(uint)uVar7 & 0xf] * pTruth[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  pAVar8 = (Aig_Tru_t *)(p->pBins + (int)(uVar5 % (uint)p->nBins));
  pAVar9 = pAVar8->pNext;
  if (pAVar8->pNext != (Aig_Tru_t *)0x0) {
    do {
      pAVar6 = pAVar9;
      uVar7 = (ulong)uVar2;
      do {
        if ((int)uVar7 < 1) {
          return &pAVar8->pNext;
        }
        lVar1 = uVar7 * 4;
        lVar3 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (*(uint *)(&pAVar9->field_0xc + lVar1) == pTruth[lVar3]);
      ppAVar4 = &pAVar9->pNext;
      pAVar8 = pAVar9;
      pAVar9 = *ppAVar4;
    } while (*ppAVar4 != (Aig_Tru_t *)0x0);
    return &pAVar6->pNext;
  }
  return &pAVar8->pNext;
}

Assistant:

Aig_Tru_t ** Aig_RManTableLookup( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    Aig_Tru_t ** ppSpot, * pEntry;
    ppSpot = p->pBins + Aig_RManTableHash( pTruth, nVars, p->nBins, s_Primes );
    for ( pEntry = *ppSpot; pEntry; ppSpot = &pEntry->pNext, pEntry = pEntry->pNext )
        if ( Kit_TruthIsEqual( pEntry->pTruth, pTruth, nVars ) )
            return ppSpot;
    return ppSpot;
}